

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v6::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  size_t __n;
  size_t in_R8;
  buffer<char> *c;
  string_view message_00;
  char *system_message;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined **local_248;
  char *local_240;
  size_t sStack_238;
  ulong local_230;
  char local_228 [504];
  
  local_258 = (char *)message.size_;
  local_250 = message.data_;
  local_240 = local_228;
  local_248 = &PTR_grow_001b5270;
  local_230 = 500;
  sStack_238 = 500;
  do {
    local_260 = local_240;
    iVar6 = internal::safe_strerror(error_code,&local_260,sStack_238);
    pcVar4 = local_258;
    if (iVar6 == 0x22) {
      uVar1 = sStack_238 * 2;
      if (local_230 < uVar1) {
        (*(code *)*local_248)(&local_248,uVar1);
      }
      iVar6 = 0;
      bVar5 = true;
      sStack_238 = uVar1;
    }
    else if (iVar6 == 0) {
      sVar3 = out->size_;
      pcVar2 = local_258 + sVar3;
      if ((char *)out->capacity_ < pcVar2) {
        (**out->_vptr_buffer)(out,pcVar2);
      }
      out->size_ = (size_t)pcVar2;
      if (pcVar4 != (char *)0x0) {
        memmove(out->ptr_ + sVar3,local_250,(size_t)pcVar4);
      }
      sVar3 = out->size_;
      uVar1 = sVar3 + 2;
      if (out->capacity_ < uVar1) {
        (**out->_vptr_buffer)(out,uVar1);
      }
      pcVar2 = local_260;
      out->size_ = uVar1;
      pcVar4 = out->ptr_;
      (pcVar4 + sVar3)[0] = ':';
      (pcVar4 + sVar3)[1] = ' ';
      __n = strlen(local_260);
      sVar3 = out->size_;
      uVar1 = sVar3 + __n;
      if (out->capacity_ < uVar1) {
        (**out->_vptr_buffer)(out,uVar1);
      }
      out->size_ = uVar1;
      iVar6 = 1;
      if (__n != 0) {
        memmove(out->ptr_ + sVar3,pcVar2,__n);
      }
      bVar5 = false;
    }
    else {
      iVar6 = 2;
      bVar5 = false;
    }
    pcVar4 = local_258;
  } while (iVar6 == 0);
  if (iVar6 == 2) {
    bVar5 = true;
  }
  local_248 = &PTR_grow_001b5270;
  if (local_240 != local_228) {
    operator_delete(local_240,local_230);
  }
  if (bVar5) {
    message_00.size_ = in_R8;
    message_00.data_ = pcVar4;
    internal::format_error_code
              ((internal *)out,(buffer<char> *)(ulong)(uint)error_code,(int)local_250,message_00);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(internal::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          internal::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        internal::writer w(out);
        w.write(message);
        w.write(": ");
        w.write(system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }